

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizeRecGroups.cpp
# Opt level: O2

HeapType __thiscall wasm::anon_unknown_0::BrandTypeIterator::operator*(BrandTypeIterator *this)

{
  FieldInfo *pFVar1;
  size_type __n;
  pointer pFVar2;
  FieldInfo *this_00;
  Field *__cur;
  size_type __n_00;
  Field FVar3;
  Field local_78;
  _Vector_base<wasm::Field,_std::allocator<wasm::Field>_> local_68;
  HeapType local_50;
  _Vector_base<wasm::Field,_std::allocator<wasm::Field>_> local_48;
  
  if (this->useArray == true) {
    local_78 = wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo::operator_cast_to_Field
                         ((this->fields).
                          super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    HeapType::HeapType(&local_50,(Array *)&local_78);
  }
  else {
    this_00 = (this->fields).
              super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pFVar1 = (this->fields).
             super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __n_00 = (long)pFVar1 - (long)this_00 >> 1;
    __n = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::_S_check_init_len
                    (__n_00,(allocator_type *)&local_48);
    pFVar2 = std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::_M_allocate
                       (&local_48,__n);
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = pFVar2 + __n_00;
    local_48._M_impl.super__Vector_impl_data._M_start = pFVar2;
    for (; this_00 != pFVar1; this_00 = this_00 + 1) {
      FVar3 = wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo::operator_cast_to_Field
                        (this_00);
      *pFVar2 = FVar3;
      pFVar2 = pFVar2 + 1;
    }
    local_68._M_impl.super__Vector_impl_data._M_start =
         local_48._M_impl.super__Vector_impl_data._M_start;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = pFVar2;
    HeapType::HeapType(&local_50,(Struct *)&local_68);
    std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base(&local_68);
    std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base(&local_48);
  }
  return (HeapType)local_50.id;
}

Assistant:

HeapType operator*() const {
    if (useArray) {
      return Array(fields[0]);
    }
    return Struct(std::vector<Field>(fields.begin(), fields.end()));
  }